

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void __thiscall
enact::Options::Options
          (Options *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *programArgs,
          unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
          *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  code *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer pbVar7;
  long lVar8;
  long lVar9;
  initializer_list<enact::Flag> __l;
  undefined1 local_2bc;
  undefined1 local_2bb;
  undefined1 local_2ba;
  allocator_type local_2b9;
  vector<enact::Flag,_std::allocator<enact::Flag>_> local_2b8;
  _Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>
  local_298;
  Flag local_268 [6];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_110;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_d0;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_b0;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_90;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_70;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_50;
  
  paVar1 = &(this->m_filename).field_2;
  (this->m_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (filename->_M_dataplus)._M_p;
  paVar2 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&filename->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_filename).field_2 + 8) = uVar6;
  }
  else {
    (this->m_filename)._M_dataplus._M_p = pcVar3;
    (this->m_filename).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_filename)._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar2;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  pbVar7 = (programArgs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (programArgs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (programArgs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<enact::Flag,_enact::Flag,_std::allocator<enact::Flag>,_std::__detail::_Identity,_std::equal_to<enact::Flag>,_std::hash<enact::Flag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&(this->m_flags)._M_h,flags,flags);
  local_50._M_f = (offset_in_Options_to_subr)enableFlag;
  local_50._8_8_ = 0;
  local_50._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_PRINT_AST;
  local_50._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_250,(char (*) [18])"--debug-print-ast",&local_50);
  local_70._M_f = (offset_in_Options_to_subr)enableFlag;
  local_70._8_8_ = 0;
  local_70._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_DISASSEMBLE_CHUNK;
  local_70._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[26],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_210,(char (*) [26])"--debug-disassemble-chunk",&local_70);
  local_90._M_f = (offset_in_Options_to_subr)enableFlag;
  local_90._8_8_ = 0;
  local_90._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_TRACE_EXECUTION;
  local_90._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[24],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_1d0,(char (*) [24])"--debug-trace-execution",&local_90);
  local_b0._M_f = (offset_in_Options_to_subr)enableFlag;
  local_b0._8_8_ = 0;
  local_b0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_STRESS_GC;
  local_b0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_190,(char (*) [18])"--debug-stress-gc",&local_b0);
  local_d0._M_f = (offset_in_Options_to_subr)enableFlag;
  local_d0._8_8_ = 0;
  local_d0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_LOG_GC;
  local_d0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[15],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_150,(char (*) [15])"--debug-log-gc",&local_d0);
  local_268[0] = DEBUG_PRINT_AST;
  local_268[1] = DEBUG_DISASSEMBLE_CHUNK;
  local_268[2] = DEBUG_TRACE_EXECUTION;
  local_268[3] = DEBUG_STRESS_GC;
  local_268[4] = 4;
  __l._M_len = 5;
  __l._M_array = local_268;
  std::vector<enact::Flag,_std::allocator<enact::Flag>_>::vector(&local_2b8,__l,&local_2b9);
  local_298._M_f = (offset_in_Options_to_subr)enableFlags;
  local_298._8_8_ = 0;
  local_298._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_start = local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_298._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_298._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[8],_std::_Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>,_true>
            (&local_110,(char (*) [8])"--debug",&local_298);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<void()>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_parseTable,&local_250,&local_d0,0,&local_2ba,&local_2bb,&local_2bc);
  lVar9 = 0;
  do {
    pcVar4 = *(code **)((long)&local_110.second.super__Function_base._M_manager + lVar9);
    if (pcVar4 != (code *)0x0) {
      lVar8 = (long)&local_110.second.super__Function_base._M_functor + lVar9;
      (*pcVar4)(lVar8,lVar8,3);
    }
    pcVar5 = *(char **)((long)&local_110.first._M_dataplus._M_p + lVar9);
    if (local_110.first.field_2._M_local_buf + lVar9 != pcVar5) {
      operator_delete(pcVar5,*(long *)((long)&local_110.first.field_2 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x40;
  } while (lVar9 != -0x180);
  if (local_298._M_bound_args.
      super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
      .super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
      super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>.
      _M_head_impl.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298._M_bound_args.
                    super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                    .super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                    .
                    super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>
                    ._M_head_impl.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298._M_bound_args.
                          super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                          .
                          super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                          .
                          super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298._M_bound_args.
                          super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                          .
                          super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>
                          .
                          super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Options::Options(std::string filename, std::vector<std::string> programArgs, std::unordered_set<Flag> flags) :
            m_filename{std::move(filename)},
            m_programArgs{std::move(programArgs)},
            m_flags{std::move(flags)} {
    }